

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleditemdelegate.cpp
# Opt level: O0

void __thiscall
QStyledItemDelegate::initStyleOption
          (QStyledItemDelegate *this,QStyleOptionViewItem *option,QModelIndex *index)

{
  QModelRoleDataSpan roleDataSpan;
  bool bVar1;
  CheckState CVar2;
  int iVar3;
  Int IVar4;
  int *piVar5;
  QVariant *pQVar6;
  ulong uVar7;
  QIcon *other;
  undefined8 *in_RDX;
  long in_RSI;
  QVariant *in_RDI;
  long in_FS_OFFSET;
  State state;
  Mode mode;
  QVariant *value;
  QStyledItemDelegatePrivate *d;
  QPixmap pixmap_1;
  QImage image;
  QPixmap pixmap;
  QSize actualSize;
  QModelRoleDataSpan modelRoleDataSpan;
  QModelIndex *in_stack_fffffffffffffe18;
  QBrush *other_00;
  undefined4 in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe24;
  undefined8 in_stack_fffffffffffffe28;
  QModelRoleData *in_stack_fffffffffffffe30;
  State local_1bc;
  QBrush local_190 [8];
  undefined1 local_188 [24];
  undefined8 local_170;
  QSize local_160;
  QIcon local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  undefined8 local_138;
  QSize local_124;
  QPixmap local_118 [24];
  QIcon local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  QIcon local_e0;
  QColor local_d8;
  undefined1 *local_c8;
  undefined1 *puStack_c0;
  undefined1 *local_b8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  undefined8 local_94;
  undefined1 *local_8c;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_84;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_80;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_7c;
  QIcon local_78;
  QBrush local_70 [12];
  QFlagsStorage<Qt::AlignmentFlag> local_64;
  QFontMetrics local_60 [8];
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined8 local_38;
  undefined4 local_30;
  undefined2 local_2c;
  QFont local_28 [16];
  QFont local_18 [16];
  long local_8;
  
  iVar3 = (int)((ulong)in_stack_fffffffffffffe28 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)(in_RSI + 0x80) = *in_RDX;
  *(undefined8 *)(in_RSI + 0x88) = in_RDX[1];
  *(undefined8 *)(in_RSI + 0x90) = in_RDX[2];
  d_func((QStyledItemDelegate *)0x85efe4);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  QModelRoleDataSpan::QModelRoleDataSpan<std::array<QModelRoleData,_7UL>,_true>
            ((QModelRoleDataSpan *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             (array<QModelRoleData,_7UL> *)in_stack_fffffffffffffe18);
  local_58 = local_48;
  local_50 = local_40;
  roleDataSpan.m_len = (qsizetype)in_RDI;
  roleDataSpan.m_modelRoleData = in_stack_fffffffffffffe30;
  QModelIndex::multiData(in_stack_fffffffffffffe18,roleDataSpan);
  QModelRoleDataSpan::dataForRole((QModelRoleDataSpan *)in_stack_fffffffffffffe30,iVar3);
  bVar1 = ::QVariant::isValid((QVariant *)
                              CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
  if ((bVar1) && (uVar7 = ::QVariant::isNull(), (uVar7 & 1) == 0)) {
    qvariant_cast<QFont>(in_RDI);
    QFont::resolve(local_18);
    QFont::operator=((QFont *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                     (QFont *)in_stack_fffffffffffffe18);
    QFont::~QFont(local_18);
    QFont::~QFont(local_28);
    QFontMetrics::QFontMetrics(local_60,(QFont *)(in_RSI + 0x58));
    QFontMetrics::operator=
              ((QFontMetrics *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
               (QFontMetrics *)in_stack_fffffffffffffe18);
    QFontMetrics::~QFontMetrics(local_60);
  }
  QModelRoleDataSpan::dataForRole((QModelRoleDataSpan *)in_stack_fffffffffffffe30,iVar3);
  bVar1 = ::QVariant::isValid((QVariant *)
                              CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
  if ((bVar1) && (uVar7 = ::QVariant::isNull(), (uVar7 & 1) == 0)) {
    local_64.i = (Int)QtPrivate::legacyFlagValueFromModelData<QFlags<Qt::AlignmentFlag>>
                                ((QVariant *)in_stack_fffffffffffffe18);
    ((QFlagsStorageHelper<Qt::AlignmentFlag,_4> *)(in_RSI + 0x40))->
    super_QFlagsStorage<Qt::AlignmentFlag> = (QFlagsStorage<Qt::AlignmentFlag>)local_64.i;
  }
  QModelRoleDataSpan::dataForRole((QModelRoleDataSpan *)in_stack_fffffffffffffe30,iVar3);
  bVar1 = ::QVariant::canConvert<QBrush>
                    ((QVariant *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
  if (bVar1) {
    in_stack_fffffffffffffe30 = (QModelRoleData *)(in_RSI + 0x28);
    qvariant_cast<QBrush>(in_RDI);
    QPalette::setBrush((QPalette *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                       (ColorRole)((ulong)in_stack_fffffffffffffe18 >> 0x20),(QBrush *)0x85f1f1);
    QBrush::~QBrush(local_70);
  }
  QModelRoleDataSpan::dataForRole((QModelRoleDataSpan *)in_stack_fffffffffffffe30,iVar3);
  bVar1 = ::QVariant::isValid((QVariant *)
                              CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
  if ((bVar1) && (uVar7 = ::QVariant::isNull(), (uVar7 & 1) == 0)) {
    QFlags<QStyleOptionViewItem::ViewItemFeature>::operator|=
              ((QFlags<QStyleOptionViewItem::ViewItemFeature> *)(in_RSI + 0x6c),HasCheckIndicator);
    CVar2 = QtPrivate::legacyEnumValueFromModelData<Qt::CheckState>
                      ((QVariant *)in_stack_fffffffffffffe18);
    *(CheckState *)(in_RSI + 0x98) = CVar2;
  }
  QModelRoleDataSpan::dataForRole((QModelRoleDataSpan *)in_stack_fffffffffffffe30,iVar3);
  bVar1 = ::QVariant::isValid((QVariant *)
                              CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
  if ((bVar1) && (uVar7 = ::QVariant::isNull(), (uVar7 & 1) == 0)) {
    QFlags<QStyleOptionViewItem::ViewItemFeature>::operator|=
              ((QFlags<QStyleOptionViewItem::ViewItemFeature> *)(in_RSI + 0x6c),HasDecoration);
    iVar3 = ::QVariant::userType((QVariant *)0x85f2b6);
    other = (QIcon *)(ulong)(iVar3 - 0x1001);
    switch(other) {
    case (QIcon *)0x0:
      local_150 = &DAT_aaaaaaaaaaaaaaaa;
      local_148 = &DAT_aaaaaaaaaaaaaaaa;
      local_140 = &DAT_aaaaaaaaaaaaaaaa;
      qvariant_cast<QPixmap>(in_RDI);
      QIcon::QIcon(&local_158,(QPixmap *)&local_150);
      QIcon::operator=((QIcon *)in_stack_fffffffffffffe30,other);
      QIcon::~QIcon(&local_158);
      local_170 = QPixmap::deviceIndependentSize();
      local_160 = QSizeF::toSize((QSizeF *)in_stack_fffffffffffffe30);
      *(QSize *)(in_RSI + 0x50) = local_160;
      QPixmap::~QPixmap((QPixmap *)&local_150);
      break;
    default:
      break;
    case (QIcon *)0x2:
      local_c8 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_c0 = &DAT_aaaaaaaaaaaaaaaa;
      local_b8 = &DAT_aaaaaaaaaaaaaaaa;
      QPixmap::QPixmap((QPixmap *)&local_c8,(QSize *)(in_RSI + 0x50));
      local_d8 = qvariant_cast<QColor>((QVariant *)in_stack_fffffffffffffe30);
      local_38 = local_d8._0_8_;
      local_30 = local_d8.ct._4_4_;
      local_2c = local_d8.ct._8_2_;
      QPixmap::fill((QColor *)&local_c8);
      QIcon::QIcon(&local_e0,(QPixmap *)&local_c8);
      QIcon::operator=((QIcon *)in_stack_fffffffffffffe30,other);
      QIcon::~QIcon(&local_e0);
      QPixmap::~QPixmap((QPixmap *)&local_c8);
      break;
    case (QIcon *)0x4:
      qvariant_cast<QIcon>(in_RDI);
      QIcon::operator=((QIcon *)in_stack_fffffffffffffe30,other);
      QIcon::~QIcon(&local_78);
      uVar7 = QIcon::isNull();
      if ((uVar7 & 1) == 0) {
        local_7c.super_QFlagsStorage<QStyle::StateFlag>.i =
             (QFlagsStorage<QStyle::StateFlag>)
             QFlags<QStyle::StateFlag>::operator&
                       ((QFlags<QStyle::StateFlag> *)
                        CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                        (StateFlag)((ulong)in_stack_fffffffffffffe18 >> 0x20));
        bVar1 = QFlags<QStyle::StateFlag>::operator!((QFlags<QStyle::StateFlag> *)&local_7c);
        if (bVar1) {
          local_1bc = Off;
        }
        else {
          local_80.super_QFlagsStorage<QStyle::StateFlag>.i =
               (QFlagsStorage<QStyle::StateFlag>)
               QFlags<QStyle::StateFlag>::operator&
                         ((QFlags<QStyle::StateFlag> *)
                          CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                          (StateFlag)((ulong)in_stack_fffffffffffffe18 >> 0x20));
          IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_80);
          if (IVar4 == 0) {
            local_1bc = On;
          }
          else {
            local_1bc = 3;
          }
        }
        local_84.super_QFlagsStorage<QStyle::StateFlag>.i =
             (QFlagsStorage<QStyle::StateFlag>)
             QFlags<QStyle::StateFlag>::operator&
                       ((QFlags<QStyle::StateFlag> *)
                        CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                        (StateFlag)((ulong)in_stack_fffffffffffffe18 >> 0x20));
        ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_84);
        local_8c = &DAT_aaaaaaaaaaaaaaaa;
        local_8c = (undefined1 *)
                   QIcon::actualSize((QSize *)(in_RSI + 0xa0),(int)in_RSI + 0x50,local_1bc);
        local_98 = QSize::width((QSize *)0x85f448);
        local_9c = QSize::width((QSize *)0x85f45c);
        piVar5 = qMin<int>(&local_98,&local_9c);
        in_stack_fffffffffffffe24 = *piVar5;
        local_a0 = QSize::height((QSize *)0x85f48c);
        local_a4 = QSize::height((QSize *)0x85f4a0);
        qMin<int>(&local_a0,&local_a4);
        QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                     (int)((ulong)in_stack_fffffffffffffe18 >> 0x20),(int)in_stack_fffffffffffffe18)
        ;
        *(undefined8 *)(in_RSI + 0x50) = local_94;
      }
      else {
        QFlags<QStyleOptionViewItem::ViewItemFeature>::operator&=
                  ((QFlags<QStyleOptionViewItem::ViewItemFeature> *)(in_RSI + 0x6c),-0x11);
      }
      break;
    case (QIcon *)0x5:
      local_f8 = &DAT_aaaaaaaaaaaaaaaa;
      local_f0 = &DAT_aaaaaaaaaaaaaaaa;
      local_e8 = &DAT_aaaaaaaaaaaaaaaa;
      qvariant_cast<QImage>(in_RDI);
      QFlags<Qt::ImageConversionFlag>::QFlags
                ((QFlags<Qt::ImageConversionFlag> *)
                 CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                 (ImageConversionFlag)((ulong)in_stack_fffffffffffffe18 >> 0x20));
      QPixmap::fromImage((QImage *)local_118,(QFlags_conflict1 *)&local_f8);
      QIcon::QIcon(&local_100,(QPixmap *)local_118);
      QIcon::operator=((QIcon *)in_stack_fffffffffffffe30,other);
      QIcon::~QIcon(&local_100);
      QPixmap::~QPixmap(local_118);
      local_138 = QImage::deviceIndependentSize();
      local_124 = QSizeF::toSize((QSizeF *)in_stack_fffffffffffffe30);
      *(QSize *)(in_RSI + 0x50) = local_124;
      QImage::~QImage((QImage *)&local_f8);
    }
    iVar3 = (int)((ulong)other >> 0x20);
  }
  pQVar6 = QModelRoleDataSpan::dataForRole((QModelRoleDataSpan *)in_stack_fffffffffffffe30,iVar3);
  bVar1 = ::QVariant::isValid((QVariant *)
                              CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
  if ((bVar1) && (uVar7 = ::QVariant::isNull(), (uVar7 & 1) == 0)) {
    QFlags<QStyleOptionViewItem::ViewItemFeature>::operator|=
              ((QFlags<QStyleOptionViewItem::ViewItemFeature> *)(in_RSI + 0x6c),HasDisplay);
    (**(code **)((in_RDI->d).data.shared + 0xb0))(local_188,in_RDI,pQVar6,in_RSI + 0x70);
    QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                       (QString *)in_stack_fffffffffffffe18);
    QString::~QString((QString *)0x85f821);
  }
  QModelRoleDataSpan::dataForRole((QModelRoleDataSpan *)in_stack_fffffffffffffe30,iVar3);
  other_00 = local_190;
  qvariant_cast<QBrush>(in_RDI);
  QBrush::operator=((QBrush *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),other_00
                   );
  QBrush::~QBrush(other_00);
  *(undefined8 *)(in_RSI + 0x38) = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStyledItemDelegate::initStyleOption(QStyleOptionViewItem *option,
                                         const QModelIndex &index) const
{
    option->index = index;

    Q_D(const QStyledItemDelegate);
    QModelRoleDataSpan modelRoleDataSpan = d->modelRoleData;
    index.multiData(modelRoleDataSpan);

    const QVariant *value;
    value = modelRoleDataSpan.dataForRole(Qt::FontRole);
    if (value->isValid() && !value->isNull()) {
        option->font = qvariant_cast<QFont>(*value).resolve(option->font);
        option->fontMetrics = QFontMetrics(option->font);
    }

    value = modelRoleDataSpan.dataForRole(Qt::TextAlignmentRole);
    if (value->isValid() && !value->isNull())
        option->displayAlignment = QtPrivate::legacyFlagValueFromModelData<Qt::Alignment>(*value);

    value = modelRoleDataSpan.dataForRole(Qt::ForegroundRole);
    if (value->canConvert<QBrush>())
        option->palette.setBrush(QPalette::Text, qvariant_cast<QBrush>(*value));

    value = modelRoleDataSpan.dataForRole(Qt::CheckStateRole);
    if (value->isValid() && !value->isNull()) {
        option->features |= QStyleOptionViewItem::HasCheckIndicator;
        option->checkState = QtPrivate::legacyEnumValueFromModelData<Qt::CheckState>(*value);
    }

    value = modelRoleDataSpan.dataForRole(Qt::DecorationRole);
    if (value->isValid() && !value->isNull()) {
        option->features |= QStyleOptionViewItem::HasDecoration;
        switch (value->userType()) {
        case QMetaType::QIcon: {
            option->icon = qvariant_cast<QIcon>(*value);
            if (option->icon.isNull()) {
                option->features &= ~QStyleOptionViewItem::HasDecoration;
                break;
            }
            QIcon::Mode mode;
            if (!(option->state & QStyle::State_Enabled))
                mode = QIcon::Disabled;
            else if (option->state & QStyle::State_Selected)
                mode = QIcon::Selected;
            else
                mode = QIcon::Normal;
            QIcon::State state = option->state & QStyle::State_Open ? QIcon::On : QIcon::Off;
            QSize actualSize = option->icon.actualSize(option->decorationSize, mode, state);
            // For highdpi icons actualSize might be larger than decorationSize, which we don't want. Clamp it to decorationSize.
            option->decorationSize = QSize(qMin(option->decorationSize.width(), actualSize.width()),
                                           qMin(option->decorationSize.height(), actualSize.height()));
            break;
        }
        case QMetaType::QColor: {
            QPixmap pixmap(option->decorationSize);
            pixmap.fill(qvariant_cast<QColor>(*value));
            option->icon = QIcon(pixmap);
            break;
        }
        case QMetaType::QImage: {
            QImage image = qvariant_cast<QImage>(*value);
            option->icon = QIcon(QPixmap::fromImage(image));
            option->decorationSize = image.deviceIndependentSize().toSize();
            break;
        }
        case QMetaType::QPixmap: {
            QPixmap pixmap = qvariant_cast<QPixmap>(*value);
            option->icon = QIcon(pixmap);
            option->decorationSize = pixmap.deviceIndependentSize().toSize();
            break;
        }
        default:
            break;
        }
    }

    value = modelRoleDataSpan.dataForRole(Qt::DisplayRole);
    if (value->isValid() && !value->isNull()) {
        option->features |= QStyleOptionViewItem::HasDisplay;
        option->text = displayText(*value, option->locale);
    }

    value = modelRoleDataSpan.dataForRole(Qt::BackgroundRole);
    option->backgroundBrush = qvariant_cast<QBrush>(*value);

    // disable style animations for checkboxes etc. within itemviews (QTBUG-30146)
    option->styleObject = nullptr;
}